

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O0

void FIX::string_replace(string *oldValue,string *newValue,string *value)

{
  string *psVar1;
  undefined8 local_28;
  size_type pos;
  string *value_local;
  string *newValue_local;
  string *oldValue_local;
  
  local_28 = std::__cxx11::string::find((string *)value,(ulong)oldValue);
  while (local_28 != 0xffffffffffffffff) {
    psVar1 = (string *)std::__cxx11::string::size();
    std::__cxx11::string::replace((ulong)value,local_28,psVar1);
    std::__cxx11::string::size();
    local_28 = std::__cxx11::string::find((string *)value,(ulong)oldValue);
  }
  return;
}

Assistant:

void string_replace( const std::string& oldValue,
                     const std::string& newValue,
                     std::string& value )
{
  for( std::string::size_type pos = value.find(oldValue);
       pos != std::string::npos;
       pos = value.find(oldValue, pos) )
  {
    value.replace( pos, oldValue.size(), newValue );
    pos += newValue.size();
  }
}